

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O0

string * __thiscall
verilogAST::Assign::toString_abi_cxx11_(string *__return_storage_ptr__,Assign *this)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Assign *local_18;
  Assign *this_local;
  
  local_18 = this;
  this_local = (Assign *)__return_storage_ptr__;
  variant_to_string<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Index,std::default_delete<verilogAST::Index>>,std::unique_ptr<verilogAST::Slice,std::default_delete<verilogAST::Slice>>>
            (&local_d8,&this->target);
  std::operator+(&local_b8,&this->prefix,&local_d8);
  std::operator+(&local_98,&local_b8," ");
  std::operator+(&local_78,&local_98,&this->symbol);
  std::operator+(&local_58,&local_78," ");
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->value);
  (**(pEVar1->super_Node)._vptr_Node)(&local_108);
  std::operator+(&local_38,&local_58,&local_108);
  std::operator+(__return_storage_ptr__,&local_38,";");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string Assign::toString() {
  return prefix + variant_to_string(target) + " " + symbol + " " +
         value->toString() + ";";
}